

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNAnd::gen_code_cond(CTPNAnd *this,CTcCodeLabel *then_label,CTcCodeLabel *else_label)

{
  CTcPrsNode *pCVar1;
  CTcCodeLabel *lbl;
  
  lbl = else_label;
  if (else_label == (CTcCodeLabel *)0x0) {
    lbl = CTcCodeStream::new_label_fwd(G_cs);
  }
  pCVar1 = (this->super_CTPNAndBase).super_CTPNBin.super_CTPNBinBase.left_;
  (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x14])(pCVar1,0,lbl);
  pCVar1 = (this->super_CTPNAndBase).super_CTPNBin.super_CTPNBinBase.right_;
  (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x14])(pCVar1,then_label,else_label);
  if (else_label != (CTcCodeLabel *)0x0) {
    return;
  }
  CTcPrsNode::def_label_pos(lbl);
  return;
}

Assistant:

void CTPNAnd::gen_code_cond(CTcCodeLabel *then_label,
                            CTcCodeLabel *else_label)
{
    CTcCodeLabel *internal_else;

    /*
     *   First, generate the conditional code for our left operand.  If the
     *   condition is false, we can short-circuit the rest of the expression
     *   by jumping directly to the 'else' label.  If the caller provided an
     *   'else' label, we can jump directly to the caller's 'else' label;
     *   otherwise, we must synthesize our own internal label, which we'll
     *   define at the end of our generated code so that we'll fall through
     *   on false to the enclosing code.  In any case, we want to fall
     *   through if the condition is true, so that control will flow to the
     *   code for our right operand if the left operand is true.  
     */
    internal_else = (else_label == 0 ? G_cs->new_label_fwd() : else_label);
    left_->gen_code_cond(0, internal_else);

    /* 
     *   Now, generate code for our right operand.  We can generate this code
     *   using the caller's destination labels directly: if we reach this
     *   code at all, it's because the left operand was true, in which case
     *   the result is simply the value of the right operand.  
     */
    right_->gen_code_cond(then_label, else_label);

    /* 
     *   If we created an internal 'else' label, it goes at the end of our
     *   generated code: this ensures that we fall off the end of our code
     *   if the left subexpression is false, which is what the caller told
     *   us they wanted when they gave us a null 'else' label.  If the
     *   caller gave us an explicit 'else' label, we'll have jumped there
     *   directly if the first subexpression was false.  
     */
    if (else_label == 0)
        def_label_pos(internal_else);
}